

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Array<unsigned_char> * __thiscall
kj::ReadableFile::readAllBytes(Array<unsigned_char> *__return_storage_ptr__,ReadableFile *this)

{
  int iVar1;
  undefined4 extraout_var;
  Array<unsigned_char> AStackY_48;
  ArrayPtr<unsigned_char> in_stack_ffffffffffffffd0;
  
  (*(this->super_FsNode)._vptr_FsNode[2])(&AStackY_48);
  heapArray<unsigned_char>(__return_storage_ptr__,AStackY_48.size_);
  iVar1 = (*(this->super_FsNode)._vptr_FsNode[6])
                    (this,0,__return_storage_ptr__->ptr,__return_storage_ptr__->size_);
  if (CONCAT44(extraout_var,iVar1) < __return_storage_ptr__->size_) {
    heapArray<unsigned_char>(in_stack_ffffffffffffffd0);
    Array<unsigned_char>::operator=(__return_storage_ptr__,&AStackY_48);
    Array<unsigned_char>::~Array(&AStackY_48);
  }
  return __return_storage_ptr__;
}

Assistant:

Array<byte> ReadableFile::readAllBytes() const {
  Array<byte> result = heapArray<byte>(stat().size);
  size_t n = read(0, result.asBytes());
  if (n < result.size()) {
    // Apparently file was truncated concurrently. Reduce to new size to match.
    result = heapArray(result.slice(0, n));
  }
  return result;
}